

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_context.cpp
# Opt level: O0

vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
* __thiscall
jessilib::io::command_context::paramaters
          (vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
           *__return_storage_ptr__,command_context *this)

{
  bool bVar1;
  unsigned_long *puVar2;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar3;
  size_type local_70;
  size_type local_68 [3];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_50;
  size_type local_38;
  size_t pos;
  u8string_view parameter;
  command_context *this_local;
  vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  *result;
  
  parameter._M_str._7_1_ = 0;
  std::
  vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  ::vector(__return_storage_ptr__);
  _pos = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)&this->m_parameter);
  local_38 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::find_first_not_of
                       ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos,' ',0);
  if (local_38 != 0xffffffffffffffff) {
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos,local_38);
    while( true ) {
      bVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::empty
                        ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_38 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::find
                           ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos,' ',0);
      if (local_38 == 0xffffffffffffffff) {
        local_38 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::size
                             ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos);
      }
      bVar3 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::substr
                        ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos,0,local_38);
      local_50 = bVar3;
      std::
      vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
      std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
                ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos,local_38);
      local_68[0] = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::find_first_not_of
                              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos,' ',0)
      ;
      local_70 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::size
                           ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos);
      puVar2 = std::min<unsigned_long>(local_68,&local_70);
      std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
                ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&pos,*puVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::u8string_view> command_context::paramaters() const {
	std::vector<std::u8string_view> result;
	std::u8string_view parameter = m_parameter;

	// Strip leading whitespace
	std::size_t pos = parameter.find_first_not_of(' ');
	if (pos == std::string_view::npos) {
		// parameter is empty; return empty vector
		return result;
	}
	parameter.remove_prefix(pos);

	// Parse parameter into result
	while (!parameter.empty()) {
		// Parse word from parameter into result
		pos = parameter.find(' ');
		if (pos == std::string_view::npos) {
			pos = parameter.size();
		}
		result.push_back(parameter.substr(0, pos));

		// Strip word and trailing whitespace
		parameter.remove_prefix(pos);
		parameter.remove_prefix(std::min(parameter.find_first_not_of(' '), parameter.size()));
	}

	return result;
}